

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool __thiscall
WarningBitsConditionChecker::Condition
          (WarningBitsConditionChecker *this,CBlockIndex *pindex,Params *params)

{
  long lVar1;
  int32_t iVar2;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  Params *in_stack_00000008;
  CBlockIndex *in_stack_00000010;
  undefined1 local_21;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_21 = false;
  if (((*(int *)(in_RDX + 0x8c) <= *(int *)(in_RSI + 0x18)) &&
      (local_21 = false, (*(uint *)(in_RSI + 0x5c) & 0xe0000000) == 0x20000000)) &&
     (local_21 = false,
     (*(int *)(in_RSI + 0x5c) >> ((byte)*(undefined4 *)(in_RDI + 0x10) & 0x1f) & 1U) != 0)) {
    iVar2 = VersionBitsCache::ComputeBlockVersion
                      ((VersionBitsCache *)params,in_stack_00000010,in_stack_00000008);
    local_21 = (iVar2 >> ((byte)*(undefined4 *)(in_RDI + 0x10) & 0x1f) & 1U) == 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_21;
  }
  __stack_chk_fail();
}

Assistant:

bool Condition(const CBlockIndex* pindex, const Consensus::Params& params) const override
    {
        return pindex->nHeight >= params.MinBIP9WarningHeight &&
               ((pindex->nVersion & VERSIONBITS_TOP_MASK) == VERSIONBITS_TOP_BITS) &&
               ((pindex->nVersion >> m_bit) & 1) != 0 &&
               ((m_chainman.m_versionbitscache.ComputeBlockVersion(pindex->pprev, params) >> m_bit) & 1) == 0;
    }